

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

value_type * __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::value_or<char_const*const&>
          (value_type *__return_storage_ptr__,optional<tinyusdz::Token> *this,char **v)

{
  if (this->has_value_ == true) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->contained);
  }
  else {
    tinyusdz::Token::Token(__return_storage_ptr__,*v);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr14 value_type value_or( U && v ) optional_refref_qual
    {
        return has_value() ? std::move( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
    }